

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_keeper.h
# Opt level: O1

int __thiscall
mp::
ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>
::AddConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>
          (ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>
           *this,int d,AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange> *args)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  int local_c;
  
  local_c = d;
  std::
  deque<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>::Container,std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>::Container>>
  ::emplace_back<int&,mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>
            ((deque<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>::Container,std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>::Container>>
              *)(this + 0xd0),&local_c,args);
  lVar1 = *(long *)(this + 0x118);
  lVar2 = *(long *)(this + 0x100);
  uVar3 = lVar2 - *(long *)(this + 0x108);
  if (uVar3 == 0) {
    lVar2 = *(long *)(lVar1 + -8) + 0x1f8;
  }
  ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>
  ::ExportConstraint((ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>
                      *)this,(int)(uVar3 >> 3) * -0x41041041 +
                             (int)((ulong)(lVar1 - *(long *)(this + 0xf8)) >> 3) +
                             (uint)(lVar1 == 0) +
                             (int)((ulong)(*(long *)(this + 0xf0) - *(long *)(this + 0xe0)) >> 3) *
                             -0x41041041 + -2,(Container *)(lVar2 + -0x1f8));
  return (int)((ulong)(*(long *)(this + 0xf0) - *(long *)(this + 0xe0)) >> 3) * -0x41041041 +
         (int)((ulong)(*(long *)(this + 0x100) - *(long *)(this + 0x108)) >> 3) * -0x41041041 +
         (int)((ulong)(*(long *)(this + 0x118) - *(long *)(this + 0xf8)) >> 3) +
         (uint)(*(long *)(this + 0x118) == 0) + -2;
}

Assistant:

int AddConstraint(int d, Args&&... args)
  {
    cons_.emplace_back( d, std::move(args)... );
    ExportConstraint(cons_.size()-1, cons_.back());
    // fmt::MemoryWriter wrt;
    // WriteCon2JSON(wrt, cons_.size()-1, cons_.back());
    // printf("%s\n", wrt.c_str());
    return cons_.size()-1;
  }